

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_prepare_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 in_R9;
  uv_prepare_t h;
  undefined1 auStack_2e8 [152];
  code *pcStack_250;
  undefined1 auStack_240 [152];
  code *pcStack_1a8;
  code *pcStack_1a0;
  undefined1 auStack_190 [120];
  code *pcStack_118;
  undefined1 auStack_108 [120];
  code *pcStack_90;
  undefined1 local_80 [120];
  
  pcStack_90 = (code *)0x16906e;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x16907e;
  uv_prepare_init(uVar2,local_80);
  pcStack_90 = (code *)0x16908d;
  uv_prepare_start(local_80,fail_cb2);
  pcStack_90 = (code *)0x169095;
  uv_unref(local_80);
  pcStack_90 = (code *)0x16909a;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x1690a4;
  uv_run(uVar2,0);
  pcStack_90 = (code *)0x1690ac;
  do_close(local_80);
  pcStack_90 = (code *)0x1690b1;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x1690c5;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_90 = (code *)0x1690cf;
  uv_run(uVar2,0);
  pcStack_90 = (code *)0x1690d4;
  uVar3 = uv_default_loop();
  pcStack_90 = (code *)0x1690dc;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_90 = run_test_check_ref;
  run_test_prepare_ref_cold_1();
  pcStack_118 = (code *)0x1690fd;
  pcStack_90 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x16910d;
  uv_check_init(uVar2,auStack_108);
  pcStack_118 = (code *)0x16911c;
  uv_check_start(auStack_108,fail_cb2);
  pcStack_118 = (code *)0x169124;
  uv_unref(auStack_108);
  pcStack_118 = (code *)0x169129;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x169133;
  uv_run(uVar2,0);
  pcStack_118 = (code *)0x16913b;
  do_close(auStack_108);
  pcStack_118 = (code *)0x169140;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x169154;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_118 = (code *)0x16915e;
  uv_run(uVar2,0);
  pcStack_118 = (code *)0x169163;
  uVar3 = uv_default_loop();
  pcStack_118 = (code *)0x16916b;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_118 = run_test_unref_in_prepare_cb;
  run_test_check_ref_cold_1();
  pcStack_1a0 = (code *)0x16918c;
  pcStack_118 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_1a0 = (code *)0x16919c;
  uv_prepare_init(uVar2,auStack_190);
  pcStack_1a0 = (code *)0x1691ab;
  uv_prepare_start(auStack_190,prepare_cb);
  pcStack_1a0 = (code *)0x1691b0;
  uVar2 = uv_default_loop();
  pcStack_1a0 = (code *)0x1691ba;
  uv_run(uVar2,0);
  pcStack_1a0 = (code *)0x1691c2;
  do_close(auStack_190);
  pcStack_1a0 = (code *)0x1691c7;
  uVar2 = uv_default_loop();
  pcStack_1a0 = (code *)0x1691db;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_1a0 = (code *)0x1691e5;
  uv_run(uVar2,0);
  pcStack_1a0 = (code *)0x1691ea;
  lVar4 = uv_default_loop();
  pcStack_1a0 = (code *)0x1691f2;
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_1a0 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (lVar4 == 0) {
    pcStack_1a8 = run_test_timer_ref;
    prepare_cb_cold_1();
    pcStack_250 = (code *)0x169222;
    pcStack_1a8 = (code *)uVar2;
    uVar2 = uv_default_loop();
    pcStack_250 = (code *)0x169232;
    uv_timer_init(uVar2,auStack_240);
    pcStack_250 = (code *)0x16923a;
    uv_unref(auStack_240);
    pcStack_250 = (code *)0x16923f;
    uVar2 = uv_default_loop();
    pcStack_250 = (code *)0x169249;
    uv_run(uVar2,0);
    pcStack_250 = (code *)0x169251;
    do_close(auStack_240);
    pcStack_250 = (code *)0x169256;
    uVar2 = uv_default_loop();
    pcStack_250 = (code *)0x16926a;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_250 = (code *)0x169274;
    uv_run(uVar2,0);
    pcStack_250 = (code *)0x169279;
    uVar3 = uv_default_loop();
    pcStack_250 = (code *)0x169281;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
    pcStack_250 = run_test_timer_ref2;
    run_test_timer_ref_cold_1();
    pcStack_250 = (code *)uVar2;
    uVar2 = uv_default_loop();
    uv_timer_init(uVar2,auStack_2e8);
    uv_timer_start(auStack_2e8,fail_cb,0x2a,0x2a);
    uv_unref(auStack_2e8);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    do_close(auStack_2e8);
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
    run_test_timer_ref2_cold_1();
    fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x39,"fail_cb should not have been called",in_R9,uVar2);
    fflush(_stderr);
    abort();
  }
  iVar1 = uv_unref();
  return iVar1;
}

Assistant:

TEST_IMPL(prepare_ref) {
  uv_prepare_t h;
  uv_prepare_init(uv_default_loop(), &h);
  uv_prepare_start(&h, (uv_prepare_cb) fail_cb2);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}